

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O2

void __thiscall
rsg::SubValueRangeIterator::SubValueRangeIterator
          (SubValueRangeIterator *this,ConstValueRangeAccess *valueRange)

{
  (this->m_stack).
  super__Vector_base<rsg::ConstValueRangeAccess,_std::allocator<rsg::ConstValueRangeAccess>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_stack).
  super__Vector_base<rsg::ConstValueRangeAccess,_std::allocator<rsg::ConstValueRangeAccess>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_stack).
  super__Vector_base<rsg::ConstValueRangeAccess,_std::allocator<rsg::ConstValueRangeAccess>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<rsg::ConstValueRangeAccess,_std::allocator<rsg::ConstValueRangeAccess>_>::push_back
            (&this->m_stack,valueRange);
  return;
}

Assistant:

SubValueRangeIterator::SubValueRangeIterator (const ConstValueRangeAccess& valueRange)
{
	m_stack.push_back(valueRange);
}